

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::VarCasted::set_target_width(VarCasted *this,uint32_t width)

{
  pointer puVar1;
  UserException *this_00;
  string local_40;
  
  puVar1 = (this->parent_var_->size_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((4 < (ulong)((long)(this->parent_var_->size_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar1)) && (*puVar1 != 1)) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Width casting for array not supported","");
    UserException::UserException(this_00,&local_40);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->cast_type_ == Resize) {
    this->target_width_ = width;
    (this->super_Var).var_width_ = width;
  }
  return;
}

Assistant:

void VarCasted::set_target_width(uint32_t width) {
    // override the current width
    if (parent_var_->size().size() > 1 && parent_var_->size().front() != 1) {
        throw UserException("Width casting for array not supported");
    }
    if (cast_type_ == VarCastType::Resize) {
        target_width_ = width;
        var_width_ = width;
    }
}